

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec_factory.h
# Opt level: O1

Encoder * __thiscall
libaom_test::AV1CodecFactory::CreateEncoder
          (undefined8 param_1,aom_codec_flags_t param_2,TwopassStatsStore *param_3)

{
  Encoder *pEVar1;
  
  pEVar1 = (Encoder *)operator_new(0x3d8);
  memcpy(&pEVar1->cfg_,&stack0x00000008,0x388);
  pEVar1->init_flags_ = param_2;
  pEVar1->stats_ = param_3;
  (pEVar1->encoder_).name = (char *)0x0;
  (pEVar1->encoder_).iface = (aom_codec_iface_t *)0x0;
  *(undefined8 *)&(pEVar1->encoder_).err = 0;
  (pEVar1->encoder_).err_detail = (char *)0x0;
  (pEVar1->encoder_).init_flags = 0;
  (pEVar1->encoder_).config.dec = (aom_codec_dec_cfg *)0x0;
  (pEVar1->encoder_).priv = (aom_codec_priv_t *)0x0;
  pEVar1->_vptr_Encoder = (_func_int **)&PTR__Encoder_005d3938;
  return pEVar1;
}

Assistant:

Encoder *CreateEncoder(aom_codec_enc_cfg_t cfg,
                         const aom_codec_flags_t init_flags,
                         TwopassStatsStore *stats) const override {
#if CONFIG_AV1_ENCODER
    return new AV1Encoder(cfg, init_flags, stats);
#else
    (void)cfg;
    (void)init_flags;
    (void)stats;
    return nullptr;
#endif
  }